

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
Parse<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
          *ds)

{
  bool bVar1;
  SizeType SVar2;
  SizeType s;
  uint *puVar3;
  Operator *pOVar4;
  State *pSVar5;
  Frag *pFVar6;
  uint uVar7;
  uint n;
  uint m;
  uint codepoint;
  Stack<rapidjson::CrtAllocator> operatorStack;
  Stack<rapidjson::CrtAllocator> operandStack;
  Stack<rapidjson::CrtAllocator> atomCountStack;
  
  operatorStack.allocator_ = *(CrtAllocator **)(this + 8);
  operandStack.ownAllocator_ = (CrtAllocator *)0x0;
  operandStack.stack_ = (char *)0x0;
  operandStack.stackTop_ = (char *)0x0;
  operandStack.stackEnd_ = (char *)0x0;
  operandStack.initialCapacity_ = 0x100;
  operatorStack.ownAllocator_ = (CrtAllocator *)0x0;
  operatorStack.stack_ = (char *)0x0;
  operatorStack.stackTop_ = (char *)0x0;
  operatorStack.stackEnd_ = (char *)0x0;
  operatorStack.initialCapacity_ = 0x100;
  atomCountStack.ownAllocator_ = (CrtAllocator *)0x0;
  atomCountStack.stack_ = (char *)0x0;
  atomCountStack.stackTop_ = (char *)0x0;
  atomCountStack.stackEnd_ = (char *)0x0;
  atomCountStack.initialCapacity_ = 0x100;
  operandStack.allocator_ = operatorStack.allocator_;
  atomCountStack.allocator_ = operatorStack.allocator_;
  puVar3 = Stack<rapidjson::CrtAllocator>::Push<unsigned_int>(&atomCountStack,1);
  *puVar3 = 0;
LAB_0011e830:
  if (ds->codepoint_ == 0) {
    goto LAB_0011eb36;
  }
  codepoint = DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
              ::Take(ds);
  uVar7 = 0xffffffff;
  switch(codepoint) {
  case 0x24:
    this[0x7d] = (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>)0x1;
    goto LAB_0011e830;
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x2c:
  case 0x2d:
    uVar7 = codepoint;
  case 0x2e:
switchD_0011e85f_caseD_2e:
    GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushOperand
              ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,&operandStack,
               uVar7);
    break;
  case 0x28:
    pOVar4 = Stack<rapidjson::CrtAllocator>::
             Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                       (&operatorStack,1);
    *pOVar4 = kLeftParenthesis;
    puVar3 = Stack<rapidjson::CrtAllocator>::Push<unsigned_int>(&atomCountStack,1);
LAB_0011ea6e:
    *puVar3 = 0;
    goto LAB_0011e830;
  case 0x29:
    while( true ) {
      if (operatorStack.stackTop_ == operatorStack.stack_) goto LAB_0011eba4;
      pOVar4 = Stack<rapidjson::CrtAllocator>::
               Top<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                         (&operatorStack);
      if (*pOVar4 == kLeftParenthesis) break;
      pOVar4 = Stack<rapidjson::CrtAllocator>::
               Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                         (&operatorStack,1);
      bVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                        ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                         &operandStack,*pOVar4);
      if (!bVar1) goto LAB_0011eba4;
    }
    if (operatorStack.stackTop_ == operatorStack.stack_) goto LAB_0011eba4;
    Stack<rapidjson::CrtAllocator>::
    Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
              (&operatorStack,1);
    Stack<rapidjson::CrtAllocator>::Pop<unsigned_int>(&atomCountStack,1);
    break;
  case 0x2a:
    bVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                      ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                       &operandStack,kZeroOrMore);
    goto LAB_0011e9a0;
  case 0x2b:
    bVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                      ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                       &operandStack,kOneOrMore);
LAB_0011e9a0:
    if (bVar1 == false) goto LAB_0011eba4;
    goto LAB_0011e830;
  default:
    if (codepoint == 0x3f) {
      bVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                        ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                         &operandStack,kZeroOrOne);
      goto LAB_0011e9a0;
    }
    if (codepoint == 0x5b) {
      bVar1 = ParseRange<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(this,ds,&n);
      if (!bVar1) goto LAB_0011eba4;
      SVar2 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::NewState
                        ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                         0xffffffff,0xffffffff,0xfffffffe);
      uVar7 = n;
      pSVar5 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetState
                         ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,SVar2
                         );
      pSVar5->rangeStart = uVar7;
      pFVar6 = Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                         (&operandStack,1);
      pFVar6->start = SVar2;
      pFVar6->out = SVar2;
      pFVar6->minIndex = SVar2;
      break;
    }
    if (codepoint == 0x5c) {
      bVar1 = CharacterEscape<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                        (this,ds,&codepoint);
      uVar7 = codepoint;
      if (bVar1) goto switchD_0011e85f_caseD_2e;
      goto LAB_0011eba4;
    }
    if (codepoint == 0x5e) {
      this[0x7c] = (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>)0x1;
      goto LAB_0011e830;
    }
    if (codepoint == 0x7b) {
      bVar1 = ParseUnsigned<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(this,ds,&n);
      if (!bVar1) goto LAB_0011eba4;
      if (ds->codepoint_ == 0x2c) {
        DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
        ::Take(ds);
        if (ds->codepoint_ == 0x7d) {
          m = 0xffffffff;
        }
        else {
          bVar1 = ParseUnsigned<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(this,ds,&m);
          if ((!bVar1) || (m < n)) goto LAB_0011eba4;
        }
      }
      else {
        m = n;
      }
      bVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::EvalQuantifier
                        ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                         &operandStack,n,m);
      if (!bVar1 || ds->codepoint_ != 0x7d) goto LAB_0011eba4;
      DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
      ::Take(ds);
      goto LAB_0011e830;
    }
    uVar7 = codepoint;
    if (codepoint == 0x7c) {
      while ((operatorStack.stackTop_ != operatorStack.stack_ &&
             (pOVar4 = Stack<rapidjson::CrtAllocator>::
                       Top<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                                 (&operatorStack), (int)*pOVar4 < 4))) {
        pOVar4 = Stack<rapidjson::CrtAllocator>::
                 Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                           (&operatorStack,1);
        bVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                          ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                           &operandStack,*pOVar4);
        if (!bVar1) goto LAB_0011eba4;
      }
      pOVar4 = Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                         (&operatorStack,1);
      *pOVar4 = kAlternation;
      puVar3 = Stack<rapidjson::CrtAllocator>::Top<unsigned_int>(&atomCountStack);
      goto LAB_0011ea6e;
    }
    goto switchD_0011e85f_caseD_2e;
  }
  GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::ImplicitConcatenation
            ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,&atomCountStack,
             &operatorStack);
  goto LAB_0011e830;
  while( true ) {
    pOVar4 = Stack<rapidjson::CrtAllocator>::
             Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                       (&operatorStack,1);
    bVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                      ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                       &operandStack,*pOVar4);
    if (!bVar1) break;
LAB_0011eb36:
    if (operatorStack.stackTop_ == operatorStack.stack_) {
      if ((long)operandStack.stackTop_ - (long)operandStack.stack_ == 0xc) {
        pFVar6 = Stack<rapidjson::CrtAllocator>::
                 Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                           (&operandStack,1);
        SVar2 = pFVar6->out;
        s = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::NewState
                      ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                       0xffffffff,0xffffffff,0);
        GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Patch
                  ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,SVar2,s);
        *(SizeType *)(this + 0x70) = pFVar6->start;
      }
      break;
    }
  }
LAB_0011eba4:
  Stack<rapidjson::CrtAllocator>::Destroy(&atomCountStack);
  Stack<rapidjson::CrtAllocator>::Destroy(&operatorStack);
  Stack<rapidjson::CrtAllocator>::Destroy(&operandStack);
  return;
}

Assistant:

void Parse(DecodedStream<InputStream, Encoding>& ds) {
        Stack<Allocator> operandStack(allocator_, 256);    // Frag
        Stack<Allocator> operatorStack(allocator_, 256);   // Operator
        Stack<Allocator> atomCountStack(allocator_, 256);  // unsigned (Atom per parenthesis)

        *atomCountStack.template Push<unsigned>() = 0;

        unsigned codepoint;
        while (ds.Peek() != 0) {
            switch (codepoint = ds.Take()) {
                case '^':
                    anchorBegin_ = true;
                    break;

                case '$':
                    anchorEnd_ = true;
                    break;

                case '|':
                    while (!operatorStack.Empty() && *operatorStack.template Top<Operator>() < kAlternation)
                        if (!Eval(operandStack, *operatorStack.template Pop<Operator>(1)))
                            return;
                    *operatorStack.template Push<Operator>() = kAlternation;
                    *atomCountStack.template Top<unsigned>() = 0;
                    break;

                case '(':
                    *operatorStack.template Push<Operator>() = kLeftParenthesis;
                    *atomCountStack.template Push<unsigned>() = 0;
                    break;

                case ')':
                    while (!operatorStack.Empty() && *operatorStack.template Top<Operator>() != kLeftParenthesis)
                        if (!Eval(operandStack, *operatorStack.template Pop<Operator>(1)))
                            return;
                    if (operatorStack.Empty())
                        return;
                    operatorStack.template Pop<Operator>(1);
                    atomCountStack.template Pop<unsigned>(1);
                    ImplicitConcatenation(atomCountStack, operatorStack);
                    break;

                case '?':
                    if (!Eval(operandStack, kZeroOrOne))
                        return;
                    break;

                case '*':
                    if (!Eval(operandStack, kZeroOrMore))
                        return;
                    break;

                case '+':
                    if (!Eval(operandStack, kOneOrMore))
                        return;
                    break;

                case '{':
                    {
                        unsigned n, m;
                        if (!ParseUnsigned(ds, &n))
                            return;

                        if (ds.Peek() == ',') {
                            ds.Take();
                            if (ds.Peek() == '}')
                                m = kInfinityQuantifier;
                            else if (!ParseUnsigned(ds, &m) || m < n)
                                return;
                        }
                        else
                            m = n;

                        if (!EvalQuantifier(operandStack, n, m) || ds.Peek() != '}')
                            return;
                        ds.Take();
                    }
                    break;

                case '.':
                    PushOperand(operandStack, kAnyCharacterClass);
                    ImplicitConcatenation(atomCountStack, operatorStack);
                    break;

                case '[':
                    {
                        SizeType range;
                        if (!ParseRange(ds, &range))
                            return;
                        SizeType s = NewState(kRegexInvalidState, kRegexInvalidState, kRangeCharacterClass);
                        GetState(s).rangeStart = range;
                        *operandStack.template Push<Frag>() = Frag(s, s, s);
                    }
                    ImplicitConcatenation(atomCountStack, operatorStack);
                    break;

                case '\\': // Escape character
                    if (!CharacterEscape(ds, &codepoint))
                        return; // Unsupported escape character
                    // fall through to default
                    RAPIDJSON_DELIBERATE_FALLTHROUGH;

                default: // Pattern character
                    PushOperand(operandStack, codepoint);
                    ImplicitConcatenation(atomCountStack, operatorStack);
            }
        }

        while (!operatorStack.Empty())
            if (!Eval(operandStack, *operatorStack.template Pop<Operator>(1)))
                return;

        // Link the operand to matching state.
        if (operandStack.GetSize() == sizeof(Frag)) {
            Frag* e = operandStack.template Pop<Frag>(1);
            Patch(e->out, NewState(kRegexInvalidState, kRegexInvalidState, 0));
            root_ = e->start;

#if RAPIDJSON_REGEX_VERBOSE
            printf("root: %d\n", root_);
            for (SizeType i = 0; i < stateCount_ ; i++) {
                State& s = GetState(i);
                printf("[%2d] out: %2d out1: %2d c: '%c'\n", i, s.out, s.out1, (char)s.codepoint);
            }
            printf("\n");
#endif
        }
    }